

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_bitstring_null(uchar **p,uchar *end,size_t *len)

{
  int ret;
  size_t *len_local;
  uchar *end_local;
  uchar **p_local;
  
  p_local._4_4_ = mbedtls_asn1_get_tag(p,end,len,3);
  if (p_local._4_4_ == 0) {
    if (*len == 0) {
      p_local._4_4_ = -0x68;
    }
    else {
      *len = *len - 1;
      if (**p == '\0') {
        *p = *p + 1;
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = -0x68;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_bitstring_null(unsigned char **p, const unsigned char *end,
                                    size_t *len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if ((ret = mbedtls_asn1_get_tag(p, end, len, MBEDTLS_ASN1_BIT_STRING)) != 0) {
        return ret;
    }

    if (*len == 0) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }
    --(*len);

    if (**p != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }
    ++(*p);

    return 0;
}